

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.h
# Opt level: O0

node_type * __thiscall
eastl::
hashtable<eastl::basic_string<char,_eastl::allocator>,_eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator,_eastl::use_first<eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>_>,_eastl::equal_to<eastl::basic_string<char,_eastl::allocator>_>,_eastl::hash<eastl::basic_string<char,_eastl::allocator>_>,_eastl::mod_range_hashing,_eastl::default_ranged_hash,_eastl::prime_rehash_policy,_false,_true,_true>
::DoAllocateNode(hashtable<eastl::basic_string<char,_eastl::allocator>,_eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator,_eastl::use_first<eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>_>,_eastl::equal_to<eastl::basic_string<char,_eastl::allocator>_>,_eastl::hash<eastl::basic_string<char,_eastl::allocator>_>,_eastl::mod_range_hashing,_eastl::default_ranged_hash,_eastl::prime_rehash_policy,_false,_true,_true>
                 *this,value_type *value)

{
  node_type *this_00;
  node_type *pNode;
  value_type *value_local;
  hashtable<eastl::basic_string<char,_eastl::allocator>,_eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator,_eastl::use_first<eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>_>,_eastl::equal_to<eastl::basic_string<char,_eastl::allocator>_>,_eastl::hash<eastl::basic_string<char,_eastl::allocator>_>,_eastl::mod_range_hashing,_eastl::default_ranged_hash,_eastl::prime_rehash_policy,_false,_true,_true>
  *this_local;
  
  this_00 = (node_type *)allocate_memory<eastl::allocator>((allocator *)&this->field_0x24,0x48,8,0);
  pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>
  ::pair((pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>
          *)this_00,value);
  this_00->mpNext =
       (hash_node<eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>,_false>
        *)0x0;
  return this_00;
}

Assistant:

typename hashtable<K, V, A, EK, Eq, H1, H2, H, RP, bC, bM, bU>::node_type*
    hashtable<K, V, A, EK, Eq, H1, H2, H, RP, bC, bM, bU>::DoAllocateNode(const value_type& value)
    {
        node_type* const pNode = (node_type*)allocate_memory(mAllocator, sizeof(node_type), kValueAlignment, kValueAlignmentOffset);

        #if EASTL_EXCEPTIONS_ENABLED
            try
            {
        #endif
                ::new(&pNode->mValue) value_type(value);
                pNode->mpNext = NULL;
                return pNode;
        #if EASTL_EXCEPTIONS_ENABLED
            }
            catch(...)
            {
                EASTLFree(mAllocator, pNode, sizeof(node_type));
                throw;
            }
        #endif
    }